

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void __thiscall
gl4cts::CopyImage::IncompatibleFormatsTest::IncompatibleFormatsTest
          (IncompatibleFormatsTest *this,Context *context)

{
  vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
  *this_00;
  pointer *pptVar1;
  iterator iVar2;
  uint uVar3;
  long lVar4;
  testCase test_case;
  testCase local_50;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"incompatible_formats",
             "Test verifies if INVALID_OPERATION is generated when textures provided to CopySubImageData are incompatible"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IncompatibleFormatsTest_021145f8;
  this_00 = &this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  uVar3 = 0xfffffffb;
  lVar4 = 0;
  do {
    local_50.m_tex_target = *(GLenum *)((long)&s_valid_targets + lVar4);
    local_50.m_dst_internal_format = 0x8d7c;
    local_50.m_dst_format = 0x8d99;
    local_50.m_dst_type = 0x1401;
    local_50.m_src_internal_format = 0x8d76;
    local_50.m_src_format = 0x8d99;
    local_50.m_src_type = 0x1403;
    local_50.m_expected_result = 0x502;
    if (1 < uVar3) {
      iVar2._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::IncompatibleFormatsTest::testCase_const&>
                  ((vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>>
                    *)this_00,iVar2,&local_50);
      }
      else {
        (iVar2._M_current)->m_src_internal_format = 0x8d76;
        (iVar2._M_current)->m_src_format = 0x8d99;
        (iVar2._M_current)->m_src_type = 0x1403;
        (iVar2._M_current)->m_expected_result = 0x502;
        (iVar2._M_current)->m_tex_target = local_50.m_tex_target;
        (iVar2._M_current)->m_dst_internal_format = 0x8d7c;
        (iVar2._M_current)->m_dst_format = 0x8d99;
        (iVar2._M_current)->m_dst_type = 0x1401;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
    }
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x2c);
  uVar3 = 0xfffffffb;
  lVar4 = 0;
  do {
    local_50.m_tex_target = *(GLenum *)((long)&s_valid_targets + lVar4);
    local_50.m_dst_internal_format = 0x8d7c;
    local_50.m_dst_format = 0x8d99;
    local_50.m_dst_type = 0x1401;
    local_50.m_src_internal_format = 0x8d70;
    local_50.m_src_format = 0x8d99;
    local_50.m_src_type = 0x1405;
    local_50.m_expected_result = 0x502;
    if (1 < uVar3) {
      iVar2._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::IncompatibleFormatsTest::testCase_const&>
                  ((vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>>
                    *)this_00,iVar2,&local_50);
      }
      else {
        (iVar2._M_current)->m_src_internal_format = 0x8d70;
        (iVar2._M_current)->m_src_format = 0x8d99;
        (iVar2._M_current)->m_src_type = 0x1405;
        (iVar2._M_current)->m_expected_result = 0x502;
        (iVar2._M_current)->m_tex_target = local_50.m_tex_target;
        (iVar2._M_current)->m_dst_internal_format = 0x8d7c;
        (iVar2._M_current)->m_dst_format = 0x8d99;
        (iVar2._M_current)->m_dst_type = 0x1401;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
    }
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x2c);
  uVar3 = 0xfffffffb;
  lVar4 = 0;
  do {
    local_50.m_tex_target = *(GLenum *)((long)&s_valid_targets + lVar4);
    local_50.m_dst_internal_format = 0x8d76;
    local_50.m_dst_format = 0x8d99;
    local_50.m_dst_type = 0x1403;
    local_50.m_src_internal_format = 0x823a;
    local_50.m_src_format = 0x8228;
    local_50.m_src_type = 0x1403;
    local_50.m_expected_result = 0x502;
    if (1 < uVar3) {
      iVar2._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::IncompatibleFormatsTest::testCase_const&>
                  ((vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>>
                    *)this_00,iVar2,&local_50);
      }
      else {
        (iVar2._M_current)->m_src_internal_format = 0x823a;
        (iVar2._M_current)->m_src_format = 0x8228;
        (iVar2._M_current)->m_src_type = 0x1403;
        (iVar2._M_current)->m_expected_result = 0x502;
        (iVar2._M_current)->m_tex_target = local_50.m_tex_target;
        (iVar2._M_current)->m_dst_internal_format = 0x8d76;
        (iVar2._M_current)->m_dst_format = 0x8d99;
        (iVar2._M_current)->m_dst_type = 0x1403;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
    }
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x2c);
  uVar3 = 0xfffffffb;
  lVar4 = 0;
  do {
    local_50.m_tex_target = *(GLenum *)((long)&s_valid_targets + lVar4);
    local_50.m_dst_internal_format = 0x8d70;
    local_50.m_dst_format = 0x8d99;
    local_50.m_dst_type = 0x1405;
    local_50.m_src_internal_format = 0x8814;
    local_50.m_src_format = 0x1908;
    local_50.m_src_type = 0x1406;
    local_50.m_expected_result = 0;
    if (1 < uVar3) {
      iVar2._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::IncompatibleFormatsTest::testCase_const&>
                  ((vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>>
                    *)this_00,iVar2,&local_50);
      }
      else {
        (iVar2._M_current)->m_src_internal_format = 0x8814;
        (iVar2._M_current)->m_src_format = 0x1908;
        (iVar2._M_current)->m_src_type = 0x1406;
        (iVar2._M_current)->m_expected_result = 0;
        (iVar2._M_current)->m_tex_target = local_50.m_tex_target;
        (iVar2._M_current)->m_dst_internal_format = 0x8d70;
        (iVar2._M_current)->m_dst_format = 0x8d99;
        (iVar2._M_current)->m_dst_type = 0x1405;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
    }
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x2c);
  uVar3 = 0xfffffffb;
  lVar4 = 0;
  do {
    local_50.m_tex_target = *(GLenum *)((long)&s_valid_targets + lVar4);
    local_50.m_dst_internal_format = 0x8058;
    local_50.m_dst_format = 0x1908;
    local_50.m_dst_type = 0x1401;
    local_50.m_src_internal_format = 0x8814;
    local_50.m_src_format = 0x1908;
    local_50.m_src_type = 0x1406;
    local_50.m_expected_result = 0x502;
    if (1 < uVar3) {
      iVar2._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::IncompatibleFormatsTest::testCase_const&>
                  ((vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>>
                    *)this_00,iVar2,&local_50);
      }
      else {
        (iVar2._M_current)->m_src_internal_format = 0x8814;
        (iVar2._M_current)->m_src_format = 0x1908;
        (iVar2._M_current)->m_src_type = 0x1406;
        (iVar2._M_current)->m_expected_result = 0x502;
        (iVar2._M_current)->m_tex_target = local_50.m_tex_target;
        (iVar2._M_current)->m_dst_internal_format = 0x8058;
        (iVar2._M_current)->m_dst_format = 0x1908;
        (iVar2._M_current)->m_dst_type = 0x1401;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
    }
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x2c);
  return;
}

Assistant:

IncompatibleFormatsTest::IncompatibleFormatsTest(deqp::Context& context)
	: TestCase(
		  context, "incompatible_formats",
		  "Test verifies if INVALID_OPERATION is generated when textures provided to CopySubImageData are incompatible")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* RGBA8UI vs RGBA16UI */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];

		testCase test_case = { tex_target,  GL_RGBA8UI,		 GL_RGBA_INTEGER,   GL_UNSIGNED_BYTE,
							   GL_RGBA16UI, GL_RGBA_INTEGER, GL_UNSIGNED_SHORT, GL_INVALID_OPERATION };

		/* Skip multisampled and rectangle targets */
		if (true == Utils::isTargetMultisampled(tex_target))
		{
			continue;
		}

		m_test_cases.push_back(test_case);
	}

	/* RGBA8UI vs RGBA32UI */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];

		testCase test_case = { tex_target,  GL_RGBA8UI,		 GL_RGBA_INTEGER, GL_UNSIGNED_BYTE,
							   GL_RGBA32UI, GL_RGBA_INTEGER, GL_UNSIGNED_INT, GL_INVALID_OPERATION };

		/* Skip multisampled and rectangle targets */
		if (true == Utils::isTargetMultisampled(tex_target))
		{
			continue;
		}

		m_test_cases.push_back(test_case);
	}

	/* RGBA16UI vs RG16UI */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];

		testCase test_case = { tex_target, GL_RGBA16UI,   GL_RGBA_INTEGER,   GL_UNSIGNED_SHORT,
							   GL_RG16UI,  GL_RG_INTEGER, GL_UNSIGNED_SHORT, GL_INVALID_OPERATION };

		/* Skip multisampled and rectangle targets */
		if (true == Utils::isTargetMultisampled(tex_target))
		{
			continue;
		}

		m_test_cases.push_back(test_case);
	}

	/* RGBA32UI vs RGBA32F */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];

		testCase test_case = { tex_target, GL_RGBA32UI, GL_RGBA_INTEGER, GL_UNSIGNED_INT,
							   GL_RGBA32F, GL_RGBA,		GL_FLOAT,		 GL_NO_ERROR };

		/* Skip multisampled and rectangle targets */
		if (true == Utils::isTargetMultisampled(tex_target))
		{
			continue;
		}

		m_test_cases.push_back(test_case);
	}

	/* RGBA8 vs RGBA32F */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];

		testCase test_case = { tex_target, GL_RGBA8, GL_RGBA,  GL_UNSIGNED_BYTE,
							   GL_RGBA32F, GL_RGBA,  GL_FLOAT, GL_INVALID_OPERATION };

		/* Skip multisampled and rectangle targets */
		if (true == Utils::isTargetMultisampled(tex_target))
		{
			continue;
		}

		m_test_cases.push_back(test_case);
	}
}